

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O0

void __thiscall QSqlField::setAutoValue(QSqlField *this,bool autoVal)

{
  QSqlFieldPrivate *pQVar1;
  byte in_SIL;
  
  detach((QSqlField *)0x133b24);
  pQVar1 = QExplicitlySharedDataPointer<QSqlFieldPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)0x133b39);
  pQVar1->field_0x70 = pQVar1->field_0x70 & 0xfb | (in_SIL & 1) << 2;
  return;
}

Assistant:

void QSqlField::setAutoValue(bool autoVal)
{
    detach();
    d->autoval = autoVal;
}